

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O2

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  Module *this_00;
  uintptr_t uVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Name name_00;
  Name name_01;
  Name name_02;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  char *pcVar6;
  size_t params_00;
  bool bVar7;
  pointer pNVar8;
  Type *pTVar9;
  Function *pFVar10;
  Export *pEVar11;
  Table *pTVar12;
  pointer puVar13;
  CallIndirect *pCVar14;
  Type in_RCX;
  int __val;
  undefined1 auVar15 [8];
  Index IVar16;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar17;
  Name NVar18;
  Signature sig_00;
  Name name_03;
  Name name_04;
  undefined1 auStack_288 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_100;
  HeapType funcType_local;
  Builder builder;
  Type local_e8;
  LocalGet *local_e0;
  Address local_d8;
  LocalGet *local_d0;
  undefined1 auStack_c8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  undefined1 auStack_a8 [8];
  Signature sig;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  undefined1 auStack_88 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  undefined1 local_68 [8];
  Name name;
  Iterator __begin1_1;
  
  local_100.id = funcType.id;
  _auStack_a8 = HeapType::getSignature(&local_100);
  bVar7 = wasm::Type::isTuple(&sig.params);
  if (bVar7) {
    Fatal::Fatal((Fatal *)auStack_288);
    std::operator<<((ostream *)
                    &args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                    "GenerateDynCalls: Cannot operate on multiple return values:");
    Fatal::operator<<((Fatal *)auStack_288,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_288);
  }
  if (this->onlyI64 == true) {
    auStack_288 = auStack_a8;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)sig.params.id;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_88 = (undefined1  [8])&args;
    PVar17 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)&args);
    pNVar8 = (pointer)0x0;
    auVar15 = (undefined1  [8])&args;
    while (PVar2.index = (size_t)pNVar8, PVar2.parent = (Type *)auVar15, PVar17 != PVar2) {
      pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_88);
      if (pTVar9->id == 3) goto LAB_00842411;
      pNVar8 = (pointer)((long)&((namedParams.
                                  super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name).super_IString.
                                str._M_len + 1);
      auVar15 = auStack_88;
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_start = pNVar8;
    }
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_88 = (undefined1  [8])auStack_288;
    PVar17 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)auStack_288);
    pNVar8 = (pointer)0x0;
    auVar15 = (undefined1  [8])auStack_288;
    while (PVar3.index = (size_t)pNVar8, PVar3.parent = (Type *)auVar15, PVar17 != PVar3) {
      pTVar9 = wasm::Type::Iterator::operator*((Iterator *)auStack_88);
      if (pTVar9->id == 3) goto LAB_00842411;
      pNVar8 = (pointer)((long)&((namedParams.
                                  super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name).super_IString.
                                str._M_len + 1);
      auVar15 = auStack_88;
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_start = pNVar8;
    }
  }
  else {
LAB_00842411:
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
              ).
              super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
              .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
              currModule;
    funcType_local.id = (uintptr_t)this_00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_88,"dynCall_",(allocator<char> *)&name.super_IString.str._M_str);
    getSig_abi_cxx11_((string *)auStack_c8,(wasm *)sig.params.id,(Type)auStack_a8,in_RCX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_c8);
    IString::IString((IString *)local_68,(string *)auStack_288);
    std::__cxx11::string::~string((string *)auStack_288);
    std::__cxx11::string::~string((string *)auStack_c8);
    std::__cxx11::string::~string((string *)auStack_88);
    NVar18.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    NVar18.super_IString.str._M_len = (size_t)local_68;
    pFVar10 = Module::getFunctionOrNull(this_00,NVar18);
    if ((pFVar10 == (Function *)0x0) &&
       (name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len,
       name_00.super_IString.str._M_len = (size_t)local_68,
       pEVar11 = Module::getExportOrNull(this_00,name_00), pEVar11 == (Export *)0x0)) {
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_c8 = (undefined1  [8])0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      auStack_288._0_4_ = 2;
      std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
      emplace_back<char_const(&)[5],wasm::Type::BasicType>
                ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_88,
                 (char (*) [5])"fptr",(BasicType *)auStack_288);
      auStack_288 = (undefined1  [8])0x2;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8,(Type *)auStack_288);
      name.super_IString.str._M_str = auStack_a8;
      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar17 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)name.super_IString.str._M_str);
      __val = 0;
      for (; params_00 = name.super_IString.str._M_len, auVar15 = local_68,
          PVar4.index = (size_t)__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                parent, PVar4.parent = (Type *)name.super_IString.str._M_str,
          PVar17 != PVar4;
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&name.super_IString.str._M_str);
        std::__cxx11::to_string((string *)auStack_288,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_88,
                   (string *)auStack_288,pTVar9);
        std::__cxx11::string::~string((string *)auStack_288);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8,pTVar9);
        __val = __val + 1;
      }
      Tuple::Tuple((Tuple *)auStack_288,(TypeList *)auStack_c8);
      wasm::Type::Type(&local_e8,(Tuple *)auStack_288);
      sig_00.results.id = sig.params.id;
      sig_00.params.id = local_e8.id;
      HeapType::HeapType((HeapType *)&builder,sig_00);
      name.super_IString.str._M_str = (char *)0x0;
      name_03.super_IString.str._M_str = (char *)auVar15;
      name_03.super_IString.str._M_len = (size_t)&sig.results;
      Builder::makeFunction
                (name_03,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)params_00,
                 (HeapType)auStack_88,
                 (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)builder.wasm,
                 (Expression *)&name.super_IString.str._M_str);
      std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
                ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                 &name.super_IString.str._M_str);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_288);
      local_d0 = MixedArena::alloc<wasm::LocalGet>(&this_00->allocator);
      local_d0->index = 0;
      (local_d0->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      auStack_288 = (undefined1  [8])0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      name.super_IString.str._M_str = auStack_a8;
      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar17 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)name.super_IString.str._M_str);
      IVar16 = 1;
      for (; PVar5.index = (size_t)__begin1_1.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent, PVar5.parent = (Type *)name.super_IString.str._M_str,
          PVar17 != PVar5;
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1)) {
        pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&name.super_IString.str._M_str);
        uVar1 = pTVar9->id;
        local_e0 = MixedArena::alloc<wasm::LocalGet>(&this_00->allocator);
        local_e0->index = IVar16;
        (local_e0->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             uVar1;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_288,
                   (Expression **)&local_e0);
        IVar16 = IVar16 + 1;
      }
      puVar13 = (this_00->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (puVar13 ==
          (this_00->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        NVar18 = Name::fromInt(0);
        wasm::Type::Type((Type *)&local_d8,(HeapType)0x1,Nullable);
        name_04.super_IString.str._M_str = NVar18.super_IString.str._M_len;
        name_04.super_IString.str._M_len = (size_t)&name.super_IString.str._M_str;
        Builder::makeTable(name_04,(Type)NVar18.super_IString.str._M_str,local_d8,(Address)0x0);
        pTVar12 = Module::addTable(this_00,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                            *)&name.super_IString.str._M_str);
        std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
                  ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
                   &name.super_IString.str._M_str);
        pcVar6 = DAT_00e643a0;
        (pTVar12->super_Importable).module.super_IString.str._M_len = ENV;
        (pTVar12->super_Importable).module.super_IString.str._M_str = pcVar6;
        Name::Name((Name *)&name.super_IString.str._M_str,"__indirect_function_table");
        (pTVar12->super_Importable).base.super_IString.str._M_len =
             (size_t)name.super_IString.str._M_str;
        (pTVar12->super_Importable).base.super_IString.str._M_str =
             (char *)__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        puVar13 = (this_00->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pCVar14 = Builder::
                makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          ((Builder *)&funcType_local,
                           (IString)*(IString *)
                                     &(((puVar13->_M_t).
                                        super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                        .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                      super_Importable).super_Named,(Expression *)local_d0,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           auStack_288,local_100,false);
      *(CallIndirect **)(sig.results.id + 0x60) = pCVar14;
      Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                   *)&sig.results);
      name_02.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
      name_02.super_IString.str._M_len = (size_t)local_68;
      name_01.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
      name_01.super_IString.str._M_len = (size_t)local_68;
      pFVar10 = Module::getFunctionOrNull(this_00,name_01);
      if (pFVar10 == (Function *)0x0) {
        __assert_fail("!must_export",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GenerateDynCalls.cpp"
                      ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
      }
      pEVar11 = Module::getExportOrNull(this_00,name_02);
      if (pEVar11 == (Export *)0x0) {
        pEVar11 = (Export *)operator_new(0x28);
        (pEVar11->value).super_IString.str._M_len = (size_t)local_68;
        (pEVar11->value).super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        (pEVar11->name).super_IString.str._M_len = (pEVar11->value).super_IString.str._M_len;
        (pEVar11->name).super_IString.str._M_str = (pEVar11->value).super_IString.str._M_str;
        pEVar11->kind = Function;
        Module::addExport(this_00,pEVar11);
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 auStack_288);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&sig.results);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8);
      std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
                ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_88);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  namedParams.emplace_back("fptr", Type::i32); // function pointer param
  params.push_back(Type::i32);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  Expression* fptr = builder.makeLocalGet(0, Type::i32);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
  }
  f->body =
    builder.makeCallIndirect(wasm->tables[0]->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}